

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestTestFunctions.cpp
# Opt level: O1

void __thiscall SixteenOneActive3::getDerivative(SixteenOneActive3 *this,double *x,double *y)

{
  double dVar1;
  double dVar2;
  
  y[0xe] = 0.0;
  y[0xf] = 0.0;
  y[0xc] = 0.0;
  y[0xd] = 0.0;
  y[10] = 0.0;
  y[0xb] = 0.0;
  y[8] = 0.0;
  y[9] = 0.0;
  y[6] = 0.0;
  y[7] = 0.0;
  y[4] = 0.0;
  y[5] = 0.0;
  y[2] = 0.0;
  y[3] = 0.0;
  *y = 0.0;
  y[1] = 0.0;
  dVar1 = sin(x[3] + x[0xf]);
  y[2] = dVar1;
  dVar1 = x[2];
  dVar2 = cos(x[3] + x[0xf]);
  y[3] = dVar2 * dVar1;
  dVar1 = x[2];
  dVar2 = cos(x[3] + x[0xf]);
  y[0xf] = dVar2 * dVar1;
  return;
}

Assistant:

void SixteenOneActive3::getDerivative(const double x[], double y[]) const{
    for (int i=0; i<16; i++)
        y[i] = 0.0;
    y[2] = std::sin(x[3] + x[15]);
    y[3] = x[2] * std::cos(x[3] + x[15]);
    y[15] = x[2] * std::cos(x[3] + x[15]);
}